

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_call_on_frame_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_on_frame_recv_callback p_Var1;
  int iVar2;
  
  p_Var1 = (session->callbacks).on_frame_recv_callback;
  if (p_Var1 != (nghttp2_on_frame_recv_callback)0x0) {
    iVar2 = (*p_Var1)(session,frame,session->user_data);
    if (iVar2 != 0) {
      return -0x386;
    }
  }
  return 0;
}

Assistant:

static int session_call_on_frame_received(nghttp2_session *session,
                                          nghttp2_frame *frame) {
  int rv;
  if (session->callbacks.on_frame_recv_callback) {
    rv = session->callbacks.on_frame_recv_callback(session, frame,
                                                   session->user_data);
    if (rv != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}